

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::descriptor_unittest::MiscTest::GetFieldDescriptorOfType(MiscTest *this,Type type)

{
  int iVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  DescriptorProto *parent;
  FieldDescriptorProto *this_00;
  pointer this_01;
  FileDescriptor *this_02;
  Descriptor *pDVar4;
  FileDescriptor *file;
  allocator<char> local_1d9;
  string local_1d8;
  FieldDescriptorProto *local_1b8;
  FieldDescriptorProto *field;
  string local_1a8;
  DescriptorProto *local_188;
  DescriptorProto *message;
  undefined1 local_160 [8];
  FileDescriptorProto file_proto;
  Type type_local;
  MiscTest *this_local;
  
  file_proto.field_0._228_4_ = type;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_160);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&file_proto.super_Message.super_MessageLite._internal_metadata_,
                      0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_160);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &file_proto.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,
             "foo.proto",pAVar3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&message,"DummyEnum");
  AddEmptyEnum((FileDescriptorProto *)local_160,_message);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"TestMessage",(allocator<char> *)((long)&field + 7));
  parent = AddMessage((FileDescriptorProto *)local_160,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&field + 7));
  local_188 = parent;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"foo",&local_1d9);
  this_00 = AddField(parent,&local_1d8,1,FieldDescriptorProto_Label_LABEL_OPTIONAL,
                     file_proto.field_0._228_4_);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  local_1b8 = this_00;
  if ((file_proto.field_0._228_4_ == 0xb) || (file_proto.field_0._228_4_ == 10)) {
    puVar2 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
    *(byte *)puVar2 = (byte)*puVar2 | 4;
    pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)this_00);
    internal::ArenaStringPtr::Set(&(this_00->field_0)._impl_.type_name_,"TestMessage",pAVar3);
  }
  else if (file_proto.field_0._228_4_ == 0xe) {
    puVar2 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
    *(byte *)puVar2 = (byte)*puVar2 | 4;
    pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)this_00);
    internal::ArenaStringPtr::Set(&(this_00->field_0)._impl_.type_name_,"DummyEnum",pAVar3);
  }
  std::make_unique<google::protobuf::DescriptorPool>();
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::operator=(&this->pool_,
              (unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
               *)&file);
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&file);
  this_01 = std::
            unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
            ::operator->(&this->pool_);
  this_02 = DescriptorPool::BuildFile(this_01,(FileDescriptorProto *)local_160);
  if ((this_02 != (FileDescriptor *)0x0) &&
     (iVar1 = FileDescriptor::message_type_count(this_02), iVar1 == 1)) {
    pDVar4 = FileDescriptor::message_type(this_02,0);
    iVar1 = Descriptor::field_count(pDVar4);
    if (iVar1 == 1) {
      pDVar4 = FileDescriptor::message_type(this_02,0);
      this_local = (MiscTest *)Descriptor::field(pDVar4,0);
      goto LAB_00688d82;
    }
  }
  this_local = (MiscTest *)0x0;
LAB_00688d82:
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_160);
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* GetFieldDescriptorOfType(FieldDescriptor::Type type) {
    FileDescriptorProto file_proto;
    file_proto.set_name("foo.proto");
    AddEmptyEnum(&file_proto, "DummyEnum");

    DescriptorProto* message = AddMessage(&file_proto, "TestMessage");
    FieldDescriptorProto* field = AddField(
        message, "foo", 1, FieldDescriptorProto::LABEL_OPTIONAL,
        static_cast<FieldDescriptorProto::Type>(static_cast<int>(type)));

    if (type == FieldDescriptor::TYPE_MESSAGE ||
        type == FieldDescriptor::TYPE_GROUP) {
      field->set_type_name("TestMessage");
    } else if (type == FieldDescriptor::TYPE_ENUM) {
      field->set_type_name("DummyEnum");
    }

    // Build the descriptors and get the pointers.
    pool_ = std::make_unique<DescriptorPool>();
    const FileDescriptor* file = pool_->BuildFile(file_proto);

    if (file != nullptr && file->message_type_count() == 1 &&
        file->message_type(0)->field_count() == 1) {
      return file->message_type(0)->field(0);
    } else {
      return nullptr;
    }
  }